

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

MaybeResult<wasm::Ok> *
wasm::WATParser::elem<wasm::WATParser::ParseDefsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx)

{
  Lexer *this;
  size_t sVar1;
  optional<wasm::Expression_*> offset;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  __index_type *table_00;
  __index_type *__rhs;
  Name NVar5;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  string local_168 [32];
  string local_148;
  string local_128;
  _Storage<wasm::Expression_*,_true> local_108;
  undefined1 uStack_100;
  undefined7 uStack_ff;
  undefined1 local_f8 [8];
  MaybeResult<wasm::Name> table;
  char *local_c8;
  size_t local_c0;
  _Storage<wasm::Expression_*,_true> local_b8;
  undefined1 local_b0 [8];
  Result<wasm::Expression_*> _val_3;
  Result<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_> elems;
  Result<wasm::Expression_*> _val_1;
  
  this = &ctx->in;
  sVar1 = (ctx->in).pos;
  expected._M_str = "elem";
  expected._M_len = 4;
  bVar2 = Lexer::takeSExprStart(this,expected);
  if (!bVar2) {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x01';
    return __return_storage_ptr__;
  }
  table.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
  super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
  super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
  super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
  super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._32_8_ = sVar1;
  Lexer::takeID((optional<wasm::Name> *)local_f8,this);
  if (table.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._8_1_ == '\0') {
    local_c8 = (char *)0x0;
    local_c0 = 0;
  }
  else {
    local_c8 = (char *)table.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._M_first
                       ._M_storage.super_IString.str._M_len;
    local_c0 = (size_t)local_f8;
  }
  table.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
  super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
  super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
  super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
  super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._24_1_ = 1;
  expected_00._M_str = "declare";
  expected_00._M_len = 7;
  bVar2 = Lexer::takeKeyword(this,expected_00);
  if (bVar2) {
LAB_00c54fc5:
    bVar4 = false;
  }
  else {
    maybeTableuse<wasm::WATParser::ParseDefsCtx>
              ((MaybeResult<wasm::Name> *)
               ((long)&_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20),ctx);
    std::__detail::__variant::_Move_assign_base<false,_wasm::Name,_wasm::None,_wasm::Err>::operator=
              ((_Move_assign_base<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_f8,
               (_Move_assign_base<false,_wasm::Name,_wasm::None,_wasm::Err> *)
               ((long)&_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
    std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err> *)
                      ((long)&_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                              super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err> *)
                    ((long)&_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                            super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20),
                    (_Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_f8);
    if (elems.val.
        super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
        .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
        super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
        super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
        super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
        super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._M_u._24_1_ ==
        '\x02') {
      std::__cxx11::string::string
                ((string *)
                 ((long)&elems.val.
                         super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                         .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err> + 0x20),
                 (string *)
                 ((long)&_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                         super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
      _Variant_storage<2ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                 (__index_type *)
                 ((long)&elems.val.
                         super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                         .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err> + 0x20))
      ;
      std::__cxx11::string::~string
                ((string *)
                 ((long)&elems.val.
                         super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                         .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err> + 0x20))
      ;
      std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err> *)
                        ((long)&_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
      goto LAB_00c55338;
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err> *)
                      ((long)&_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                              super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
    expected_01._M_str = "offset";
    expected_01._M_len = 6;
    bVar4 = Lexer::takeSExprStart(this,expected_01);
    if (bVar4) {
      expr<wasm::WATParser::ParseDefsCtx>
                ((Result<wasm::Expression_*> *)
                 ((long)&_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                         super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20),ctx);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err> *)
                      ((long)&elems.val.
                              super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                              .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                              super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                              super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                              super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err> +
                      0x20),(_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err> *)
                            ((long)&_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
      if (_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
          super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
          super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
          super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
          super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._24_1_ == '\x01') {
        std::__cxx11::string::string
                  ((string *)local_b0,
                   (string *)
                   ((long)&elems.val.
                           super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                           .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                           super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                           super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                           super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err> + 0x20
                   ));
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                   local_b0);
        std::__cxx11::string::~string((string *)local_b0);
        std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)
                          ((long)&elems.val.
                                  super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                                  .
                                  super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                  .
                                  super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                  .
                                  super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                  .
                                  super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                          + 0x20));
        std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)
                          ((long)&_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
        goto LAB_00c55338;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)
                        ((long)&elems.val.
                                super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                                .
                                super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                .
                                super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                .super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                                super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err> +
                        0x20));
      local_b8 = (_Storage<wasm::Expression_*,_true>)
                 _val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                 super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_;
      std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)
                        ((long)&_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
      bVar4 = true;
    }
    else {
      sVar1 = this->pos;
      bVar4 = Lexer::takeLParen(this);
      if (!bVar4) goto LAB_00c54fc5;
      instr<wasm::WATParser::ParseDefsCtx>
                ((MaybeResult<wasm::Ok> *)
                 ((long)&_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                         super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20),ctx);
      if (elems.val.
          super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
          .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
          super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
          super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
          super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
          super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._M_u._24_1_ !=
          '\x01') {
        std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>::
        _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                        ((long)&elems.val.
                                super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                                .
                                super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                .
                                super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                .super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                                super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err> +
                        0x20),(_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                              ((long)&_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20))
        ;
        if (_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
            super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
            super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
            super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
            super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._24_1_ == '\x02') {
          std::__cxx11::string::string
                    ((string *)local_b0,
                     (string *)
                     ((long)&elems.val.
                             super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                             .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                             super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                             super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                             super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err> +
                     0x20));
          std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
          _Variant_storage<2ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__
                     ,local_b0);
          std::__cxx11::string::~string((string *)local_b0);
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                            ((long)&elems.val.
                                    super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                                    .
                                    super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                    .
                                    super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                    .
                                    super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                    .
                                    super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                            + 0x20));
        }
        else {
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                            ((long)&elems.val.
                                    super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                                    .
                                    super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                    .
                                    super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                    .
                                    super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                    .
                                    super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                            + 0x20));
          ParseDefsCtx::makeExpr
                    ((Result<wasm::Expression_*> *)
                     ((long)&elems.val.
                             super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                             .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                             super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                             super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                             super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err> +
                     0x20),ctx);
          std::__detail::__variant::_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err>::
          _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err> *)local_b0,
                          (_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err> *)
                          ((long)&elems.val.
                                  super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                                  .
                                  super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                  .
                                  super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                  .
                                  super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                  .
                                  super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                          + 0x20));
          if (_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
              super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
              super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
              super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
              super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._24_1_ != '\x01') {
            std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)local_b0);
            local_b8 = (_Storage<wasm::Expression_*,_true>)
                       elems.val.
                       super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                       .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                       super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                       super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                       super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                       super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                       _32_8_;
            std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)
                              ((long)&elems.val.
                                      super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                                      .
                                      super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                      .
                                      super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                      .
                                      super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                      .
                                      super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                              + 0x20));
            bVar4 = true;
            goto LAB_00c551eb;
          }
          std::__cxx11::string::string(local_168,(string *)local_b0);
          std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
          _Variant_storage<2ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__
                     ,local_168);
          std::__cxx11::string::~string(local_168);
          std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)local_b0);
          std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)
                            ((long)&elems.val.
                                    super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                                    .
                                    super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                    .
                                    super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                    .
                                    super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                    .
                                    super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                            + 0x20));
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                          ((long)&_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
        goto LAB_00c55338;
      }
      this->pos = sVar1;
      Lexer::advance(this);
      bVar4 = false;
LAB_00c551eb:
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                        ((long)&_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
      if (!bVar4) goto LAB_00c54fcc;
    }
    bVar3 = Lexer::takeRParen(this);
    if (!bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_148,"expected end of offset expression",
                 (allocator<char> *)
                 ((long)&elems.val.
                         super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                         .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err> + 0x20))
      ;
      Lexer::err((Err *)((long)&_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20),this,
                 &local_148);
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
      _Variant_storage<2ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                 (__index_type *)
                 ((long)&_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                         super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
      std::__cxx11::string::~string
                ((string *)
                 ((long)&_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                         super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
      std::__cxx11::string::~string((string *)&local_148);
      goto LAB_00c55338;
    }
  }
LAB_00c54fcc:
  elemlist<wasm::WATParser::ParseDefsCtx>
            ((Result<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_> *)
             ((long)&_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                     super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20),ctx,
             table.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x01');
  __rhs = (__index_type *)
          ((long)&_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                  super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20);
  std::__detail::__variant::
  _Copy_ctor_base<false,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                     *)((long)&elems.val.
                               super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                               .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                               .super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                               .super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                               super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err> +
                       0x20),(_Copy_ctor_base<false,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                              *)__rhs);
  if (_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._24_1_ == '\x01') {
    std::__cxx11::string::string
              ((string *)local_b0,
               (string *)
               ((long)&elems.val.
                       super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                       .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                       super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                       super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                       super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err> + 0x20));
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
    _Variant_storage<2ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
               local_b0);
    std::__cxx11::string::~string((string *)local_b0);
    std::__detail::__variant::
    _Variant_storage<false,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                         *)((long)&elems.val.
                                   super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                                   .
                                   super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                   .
                                   super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                   .
                                   super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                   .
                                   super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                           + 0x20));
  }
  else {
    std::__detail::__variant::
    _Variant_storage<false,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                         *)((long)&elems.val.
                                   super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                                   .
                                   super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                   .
                                   super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                   .
                                   super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                   .
                                   super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                           + 0x20));
    bVar3 = Lexer::takeRParen(this);
    if (bVar3) {
      if (!bVar2) {
        table_00 = local_f8;
        if (table.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._24_1_ != '\0') {
          table_00 = (__index_type *)0x0;
        }
        local_108._M_value = local_b8._M_value;
        if (elems.val.
            super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
            .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
            super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
            super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
            super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
            super__Variant_storage_alias<std::vector<wasm::Expression_*>,_wasm::Err>._M_u._24_1_ !=
            '\0') {
          __rhs = (__index_type *)0x0;
        }
        offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Expression_*>._9_7_ = uStack_ff;
        offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Expression_*>._M_engaged = bVar4;
        offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Expression_*>._M_payload._M_value = local_b8._M_value;
        NVar5.super_IString.str._M_str = local_c8;
        NVar5.super_IString.str._M_len = local_c0;
        uStack_100 = bVar4;
        ParseDefsCtx::addElem
                  ((Result<wasm::Ok> *)
                   ((long)&elems.val.
                           super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                           .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                           super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                           super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                           super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err> + 0x20
                   ),ctx,NVar5,(Name *)table_00,offset,
                   (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)__rhs,
                   table.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._32_4_);
        if (_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
            super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
            super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
            super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
            super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._24_1_ == '\x01') {
          std::__cxx11::string::string
                    ((string *)local_b0,
                     (string *)
                     ((long)&elems.val.
                             super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                             .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                             super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                             super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                             super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err> +
                     0x20));
          std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
          _Variant_storage<2ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__
                     ,local_b0);
          std::__cxx11::string::~string((string *)local_b0);
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                     ((long)&elems.val.
                             super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                             .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                             super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                             super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                             super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err> +
                     0x20));
          goto LAB_00c5532f;
        }
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                 ((long)&elems.val.
                         super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                         .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err> + 0x20))
      ;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\0';
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_128,"expected end of element segment",(allocator<char> *)local_b0)
      ;
      Lexer::err((Err *)((long)&elems.val.
                                super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                                .
                                super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                .
                                super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>
                                .super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                                super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err> +
                        0x20),this,&local_128);
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
      _Variant_storage<2ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                 (__index_type *)
                 ((long)&elems.val.
                         super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                         .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err> + 0x20))
      ;
      std::__cxx11::string::~string
                ((string *)
                 ((long)&elems.val.
                         super__Variant_base<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                         .super__Move_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         super__Copy_assign_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         super__Move_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err>.
                         super__Copy_ctor_alias<std::vector<wasm::Expression_*>,_wasm::Err> + 0x20))
      ;
      std::__cxx11::string::~string((string *)&local_128);
    }
  }
LAB_00c5532f:
  std::__detail::__variant::
  _Variant_storage<false,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
  ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_wasm::Err>
                       *)((long)&_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
LAB_00c55338:
  std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_f8);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> elem(Ctx& ctx) {
  auto pos = ctx.in.getPos();
  if (!ctx.in.takeSExprStart("elem"sv)) {
    return {};
  }

  Name name;
  if (auto id = ctx.in.takeID()) {
    name = *id;
  }

  bool isDeclare = false;
  MaybeResult<typename Ctx::TableIdxT> table;
  std::optional<typename Ctx::ExprT> offset;

  if (ctx.in.takeKeyword("declare"sv)) {
    isDeclare = true;
  } else {
    table = maybeTableuse(ctx);
    CHECK_ERR(table);

    if (ctx.in.takeSExprStart("offset")) {
      auto off = expr(ctx);
      CHECK_ERR(off);
      offset = *off;
    } else {
      // This may be an abbreviated offset instruction or it may be the
      // beginning of the elemlist.
      auto beforeLParen = ctx.in.getPos();
      if (ctx.in.takeLParen()) {
        if (auto inst = instr(ctx)) {
          CHECK_ERR(inst);
          auto off = ctx.makeExpr();
          CHECK_ERR(off);
          offset = *off;
        } else {
          // This must be the beginning of the elemlist instead.
          ctx.in.setPos(beforeLParen);
        }
      }
    }
    if (offset && !ctx.in.takeRParen()) {
      return ctx.in.err("expected end of offset expression");
    }
  }

  // If there is no explicit tableuse, we can use the legacy elemlist format.
  bool legacy = !table;
  auto elems = elemlist(ctx, legacy);
  CHECK_ERR(elems);

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of element segment");
  }

  if (isDeclare) {
    CHECK_ERR(ctx.addDeclareElem(name, std::move(*elems), pos));
  } else {
    CHECK_ERR(
      ctx.addElem(name, table.getPtr(), offset, std::move(*elems), pos));
  }

  return Ok{};
}